

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O2

size_t Disa::pseudo_peripheral_vertex<Disa::Adjacency_Subgraph>
                 (Adjacency_Subgraph *graph,size_t i_start)

{
  Adjacency_Graph<false> *this;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ostream *poVar6;
  source_location *in_RCX;
  bool bVar7;
  size_t i_start_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distance;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar1 = (long)(graph->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(graph->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  i_start_local = i_start;
  if ((uVar1 == 0) || (uVar1 < 9)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_s__workspace_llm4binary_github_lic_00155d68;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&distance,
               (Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar6 = std::operator<<(poVar6,(string *)&distance);
    poVar6 = std::operator<<(poVar6,"The parsed graph is empty.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    if (i_start < ((long)uVar1 >> 3) - 1U) {
      this = &graph->graph;
      sVar2 = Adjacency_Graph<false>::degree(this,&i_start_local);
      if (sVar2 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"\n");
        local_48._M_impl.super__Vector_impl_data._M_start =
             (pointer)&PTR_s__workspace_llm4binary_github_lic_00155d98;
        console_format_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&distance,
                   (Disa *)0x1,(Log_Level)&local_48,in_RCX);
        poVar6 = std::operator<<(poVar6,(string *)&distance);
        std::operator<<(poVar6,"The parsed start vertex has a 0 degree.");
        std::ostream::flush();
        std::__cxx11::string::~string((string *)&distance);
      }
      else {
        distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar7 = false;
        uVar1 = 0;
        while (sVar2 = i_start_local, !bVar7) {
          level_traversal<Disa::Adjacency_Subgraph>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,graph,
                     i_start_local,0xffffffffffffffff);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                    (&distance,&local_48);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48)
          ;
          bVar7 = true;
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          while( true ) {
            lVar3 = (long)(graph->graph).offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(graph->graph).offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
            if ((lVar3 == 0) ||
               ((pointer)((lVar3 >> 3) - 1U) <= local_48._M_impl.super__Vector_impl_data._M_start))
            break;
            uVar4 = distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(long)local_48._M_impl.super__Vector_impl_data._M_start];
            if (uVar1 < uVar4) {
LAB_001157a5:
              bVar7 = false;
              uVar1 = uVar4;
              i_start_local = (size_t)local_48._M_impl.super__Vector_impl_data._M_start;
            }
            else if (uVar4 == uVar1) {
              sVar2 = Adjacency_Graph<false>::degree(this,(size_t *)&local_48);
              sVar5 = Adjacency_Graph<false>::degree(this,&i_start_local);
              if (sVar2 < sVar5) {
                uVar4 = distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start
                        [(long)local_48._M_impl.super__Vector_impl_data._M_start];
                goto LAB_001157a5;
              }
            }
            local_48._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((long)local_48._M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&distance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        i_start_local = sVar2;
      }
      return i_start_local;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_s__workspace_llm4binary_github_lic_00155d80;
    console_format_abi_cxx11_
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&distance,
               (Disa *)0x0,(Log_Level)&local_48,in_RCX);
    poVar6 = std::operator<<(poVar6,(string *)&distance);
    poVar6 = std::operator<<(poVar6,"The parsed start vertex is not in the graph.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&distance);
  exit(1);
}

Assistant:

std::size_t pseudo_peripheral_vertex(const _graph& graph, std::size_t i_start = 0) {

  ASSERT_DEBUG(!graph.empty(), "The parsed graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(), "The parsed start vertex is not in the graph.");
  if(graph.degree(i_start) == 0) {
    WARNING("The parsed start vertex has a 0 degree.");
    return i_start;
  }

  // Calculate the distance of each vertex from the starting vertex
  bool found = false;
  std::size_t max_distance = 0;
  std::size_t& pseudo_peripheral_node = i_start;
  std::vector<std::size_t> distance;

  // Calculate the eccentricity of each vertex
  while(!found) {
    found = true;
    distance = level_traversal(graph, pseudo_peripheral_node);
    FOR(i_vertex, graph.size_vertex()) {
      if(distance[i_vertex] > max_distance ||
         (distance[i_vertex] == max_distance && graph.degree(i_vertex) < graph.degree(pseudo_peripheral_node))) {
        max_distance = distance[i_vertex];
        pseudo_peripheral_node = i_vertex;
        found = false;
      }
    }
  }
  return pseudo_peripheral_node;
}